

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_HmacSha256KeyEmpty_Test::~CryptoUtil_HmacSha256KeyEmpty_Test
          (CryptoUtil_HmacSha256KeyEmpty_Test *this)

{
  CryptoUtil_HmacSha256KeyEmpty_Test *this_local;
  
  ~CryptoUtil_HmacSha256KeyEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha256KeyEmpty) {
  try {
    std::vector<uint8_t> key;
    ByteData data(
        "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
    ByteData256 byte_data = CryptoUtil::HmacSha256(key, data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "HmacSha256 error.");
    return;
  }
  ASSERT_TRUE(false);
}